

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  ImVec2 *pIVar1;
  int *piVar2;
  ImGuiNavMoveResult *pIVar3;
  float fVar4;
  float fVar5;
  char *pcVar6;
  _func_bool_ImGuiViewport_ptr *p_Var7;
  ImGuiWindow **ppIVar8;
  _func_float_ImGuiViewport_ptr *p_Var9;
  ImGuiViewportP *pIVar10;
  _func_void_ImGuiViewport_ptr *p_Var11;
  ImGuiPopupData *pIVar12;
  ImGuiContext *ctx;
  bool bVar13;
  bool bVar14;
  uint uVar15;
  undefined4 extraout_EAX;
  ImGuiID IVar16;
  int iVar17;
  int iVar18;
  ImGuiContext *g_6;
  ImGuiWindow *pIVar19;
  ImGuiContext *pIVar20;
  ImGuiWindow **__dest;
  ImGuiPopupData *__dest_00;
  ImGuiID IVar21;
  ImGuiInputSource IVar22;
  ImGuiWindow *parent_window;
  ImGuiViewportP *pIVar23;
  ImGuiWindow *pIVar24;
  ImGuiWindow *window;
  undefined4 uVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  undefined8 extraout_RDX;
  ImGuiContext *g;
  ImGuiDir IVar29;
  ImGuiWindow *old_nav_window;
  float *pfVar30;
  ImGuiContext *pIVar31;
  ImGuiNavLayer IVar32;
  long lVar33;
  ImFont *font;
  ImGuiViewportP **ppIVar34;
  float *pfVar35;
  bool *pbVar36;
  ImGuiContext *g_1;
  byte bVar37;
  ImGuiContext *g_9;
  ImGuiNavMoveResult *pIVar38;
  ImGuiContext *g_3;
  ImGuiContext *pIVar39;
  ulong uVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  byte bVar44;
  uint uVar45;
  uint uVar46;
  float fVar47;
  ImVec2 IVar49;
  float fVar48;
  ImVec2 IVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  ImVec2 IVar54;
  float fVar57;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar58;
  undefined1 auVar59 [16];
  float fVar60;
  ImVec2 IVar61;
  float fVar63;
  undefined1 auVar62 [16];
  double dVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  ImGuiViewportP *local_80;
  ImVec2 local_60;
  undefined4 local_54;
  ImRect local_50;
  long local_40;
  long local_38;
  
  ctx = GImGui;
  bVar44 = 0;
  GImGui->ConfigFlagsLastFrame = GImGui->ConfigFlagsCurrFrame;
  if (((ctx->IO).ConfigWindowsResizeFromEdges == true) && (((ctx->IO).BackendFlags & 2) == 0)) {
    (ctx->IO).ConfigWindowsResizeFromEdges = false;
  }
  uVar15 = (ctx->IO).ConfigFlags;
  if (((uVar15 >> 10 & 1) != 0) && ((~(ctx->IO).BackendFlags & 0x1400U) != 0)) {
    uVar15 = uVar15 & 0xfffffbff;
    (ctx->IO).ConfigFlags = uVar15;
  }
  ctx->ConfigFlagsCurrFrame = uVar15;
  if (ctx->SettingsLoaded == false) {
    pcVar6 = (ctx->IO).IniFilename;
    if (pcVar6 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar6);
    }
    ctx->SettingsLoaded = true;
  }
  if ((0.0 < ctx->SettingsDirtyTimer) &&
     (fVar47 = ctx->SettingsDirtyTimer - (ctx->IO).DeltaTime, ctx->SettingsDirtyTimer = fVar47,
     fVar47 <= 0.0)) {
    pcVar6 = (ctx->IO).IniFilename;
    if (pcVar6 == (char *)0x0) {
      (ctx->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar6);
    }
    ctx->SettingsDirtyTimer = 0.0;
  }
  ctx->Time = (double)(ctx->IO).DeltaTime + ctx->Time;
  ctx->WithinFrameScope = true;
  ctx->FrameCount = ctx->FrameCount + 1;
  ctx->TooltipOverrideCount = 0;
  ctx->WindowsActiveCount = 0;
  pIVar31 = GImGui;
  uVar15 = GImGui->ConfigFlagsCurrFrame;
  if ((uVar15 >> 10 & 1) == 0) {
    local_80 = *(GImGui->Viewports).Data;
    local_50.Min.x = 0.0;
    local_50.Min.y = 0.0;
    local_60 = (GImGui->IO).DisplaySize;
  }
  else {
    iVar18 = (GImGui->Viewports).Size;
    if (0 < iVar18) {
      lVar26 = 0;
      do {
        p_Var7 = (pIVar31->PlatformIO).Platform_GetWindowMinimized;
        if ((p_Var7 != (_func_bool_ImGuiViewport_ptr *)0x0) &&
           (pIVar23 = (pIVar31->Viewports).Data[lVar26], pIVar23->PlatformWindowCreated == true)) {
          bVar41 = (*p_Var7)(&pIVar23->super_ImGuiViewport);
          (pIVar23->super_ImGuiViewport).Flags =
               (uint)bVar41 << 7 | (pIVar23->super_ImGuiViewport).Flags & 0xffffff7fU;
          iVar18 = (pIVar31->Viewports).Size;
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 < iVar18);
    }
    local_80 = *(pIVar31->Viewports).Data;
    local_50.Min = (*(pIVar31->PlatformIO).Platform_GetWindowPos)(&local_80->super_ImGuiViewport);
    local_60 = (pIVar31->IO).DisplaySize;
    if (((local_80->super_ImGuiViewport).Flags & 0x80) != 0) {
      local_50.Min = (local_80->super_ImGuiViewport).Pos;
      local_60 = (local_80->super_ImGuiViewport).Size;
    }
  }
  uVar46 = 0;
  AddUpdateViewport((ImGuiWindow *)0x0,0x11111111,&local_50.Min,&local_60,0x200);
  pIVar31->CurrentDpiScale = 0.0;
  pIVar31->CurrentViewport = (ImGuiViewportP *)0x0;
  pIVar31->MouseViewport = (ImGuiViewportP *)0x0;
  iVar18 = (pIVar31->Viewports).Size;
  if (0 < iVar18) {
    do {
      ppIVar34 = (pIVar31->Viewports).Data;
      pIVar23 = ppIVar34[(int)uVar46];
      *(uint *)&(pIVar23->super_ImGuiViewport).field_0x54 = uVar46;
      if (((int)uVar46 < 1) || (pIVar31->FrameCount + -2 <= pIVar23->LastFrameActive)) {
        bVar41 = pIVar23->PlatformWindowCreated;
        if (((uVar15 >> 10 & 1) != 0) &&
           ((((pIVar23->super_ImGuiViewport).Flags & 0x80) == 0 & bVar41) == 1)) {
          if ((pIVar23->super_ImGuiViewport).PlatformRequestMove == true) {
            IVar49 = (*(pIVar31->PlatformIO).Platform_GetWindowPos)(&pIVar23->super_ImGuiViewport);
            pIVar23->LastPlatformPos = IVar49;
            (pIVar23->super_ImGuiViewport).Pos = IVar49;
          }
          if ((pIVar23->super_ImGuiViewport).PlatformRequestResize == true) {
            IVar49 = (*(pIVar31->PlatformIO).Platform_GetWindowSize)(&pIVar23->super_ImGuiViewport);
            pIVar23->LastPlatformSize = IVar49;
            (pIVar23->super_ImGuiViewport).Size = IVar49;
          }
        }
        UpdateViewportPlatformMonitor(pIVar23);
        pIVar23->Alpha = 1.0;
        if (((pIVar23->super_ImGuiViewport).Flags & 0x200) != 0) {
          pIVar1 = &(pIVar23->super_ImGuiViewport).Pos;
          IVar49 = *pIVar1;
          IVar61 = pIVar23->LastPos;
          iVar18 = -(uint)(IVar49.x - IVar61.x != 0.0);
          iVar17 = -(uint)(IVar49.y - IVar61.y != 0.0);
          auVar51._4_4_ = iVar17;
          auVar51._0_4_ = iVar18;
          auVar51._8_4_ = iVar17;
          auVar51._12_4_ = iVar17;
          auVar66._8_8_ = auVar51._8_8_;
          auVar66._4_4_ = iVar18;
          auVar66._0_4_ = iVar18;
          iVar18 = movmskpd(extraout_EAX,auVar66);
          if (iVar18 != 0) {
            TranslateWindowsInViewport(pIVar23,&pIVar23->LastPos,pIVar1);
          }
        }
        p_Var9 = (pIVar31->PlatformIO).Platform_GetWindowDpiScale;
        if ((p_Var9 == (_func_float_ImGuiViewport_ptr *)0x0) || (bVar41 == false)) {
          if ((long)pIVar23->PlatformMonitor == -1) {
            fVar47 = (pIVar23->super_ImGuiViewport).DpiScale;
            uVar45 = -(uint)(fVar47 != 0.0);
            fVar47 = (float)(~uVar45 & 0x3f800000 | (uint)fVar47 & uVar45);
          }
          else {
            fVar47 = (pIVar31->PlatformIO).Monitors.Data[pIVar23->PlatformMonitor].DpiScale;
          }
        }
        else {
          fVar47 = (*p_Var9)(&pIVar23->super_ImGuiViewport);
        }
        fVar58 = (pIVar23->super_ImGuiViewport).DpiScale;
        if ((fVar58 != 0.0) || (NAN(fVar58))) {
          if (((fVar47 != fVar58) || (NAN(fVar47) || NAN(fVar58))) &&
             (((pIVar31->IO).ConfigFlags & 0x4000) != 0)) {
            ScaleWindowsInViewport(pIVar23,fVar47 / fVar58);
          }
        }
        (pIVar23->super_ImGuiViewport).DpiScale = fVar47;
        uVar46 = uVar46 + 1;
      }
      else {
        lVar26 = (long)(pIVar31->Windows).Size;
        if (0 < lVar26) {
          ppIVar8 = (pIVar31->Windows).Data;
          lVar33 = 0;
          do {
            pIVar19 = ppIVar8[lVar33];
            if (pIVar19->Viewport == pIVar23) {
              pIVar19->Viewport = (ImGuiViewportP *)0x0;
              ppIVar8[lVar33]->ViewportOwned = false;
            }
            lVar33 = lVar33 + 1;
          } while (lVar26 != lVar33);
        }
        if (pIVar23 == pIVar31->MouseLastHoveredViewport) {
          pIVar31->MouseLastHoveredViewport = (ImGuiViewportP *)0x0;
        }
        uVar40 = (ulong)uVar46;
        memmove(ppIVar34 + uVar40,ppIVar34 + uVar40 + 1,(~uVar40 + (long)iVar18) * 8);
        (pIVar31->Viewports).Size = (pIVar31->Viewports).Size + -1;
        DestroyPlatformWindow(pIVar23);
        IM_DELETE<ImGuiViewportP>(pIVar23);
      }
      iVar18 = (pIVar31->Viewports).Size;
    } while ((int)uVar46 < iVar18);
  }
  if ((uVar15 >> 10 & 1) == 0) {
LAB_00152ce4:
    pIVar31->MouseViewport = local_80;
  }
  else {
    if (((pIVar31->IO).BackendFlags & 0x800) == 0) {
      uVar40 = (ulong)(uint)(GImGui->Viewports).Size;
LAB_00152d94:
      if ((int)uVar40 < 1) goto LAB_0015312e;
      IVar49 = (pIVar31->IO).MousePos;
      fVar47 = IVar49.x;
      fVar58 = IVar49.y;
      uVar27 = 0;
      pIVar23 = (ImGuiViewportP *)0x0;
      do {
        pIVar10 = (GImGui->Viewports).Data[uVar27];
        if (((((((pIVar10->super_ImGuiViewport).Flags & 0x90) == 0) &&
              (fVar48 = (pIVar10->super_ImGuiViewport).Pos.x, fVar48 <= fVar47)) &&
             (fVar60 = (pIVar10->super_ImGuiViewport).Pos.y, fVar60 <= fVar58)) &&
            ((fVar47 < fVar48 + (pIVar10->super_ImGuiViewport).Size.x &&
             (fVar58 < fVar60 + (pIVar10->super_ImGuiViewport).Size.y)))) &&
           ((pIVar23 == (ImGuiViewportP *)0x0 ||
            (pIVar23->LastFrontMostStampCount < pIVar10->LastFrontMostStampCount)))) {
          pIVar23 = pIVar10;
        }
        uVar27 = uVar27 + 1;
      } while ((uVar40 & 0xffffffff) != uVar27);
      if (pIVar23 == (ImGuiViewportP *)0x0) goto LAB_0015312e;
LAB_00152e0f:
      pIVar31->MouseLastHoveredViewport = pIVar23;
      bVar41 = false;
      local_80 = pIVar23;
    }
    else {
      IVar21 = (pIVar31->IO).MouseHoveredViewport;
      if ((IVar21 != 0) && (uVar40 = (ulong)(GImGui->Viewports).Size, 0 < (long)uVar40)) {
        uVar27 = 0;
        do {
          pIVar23 = (GImGui->Viewports).Data[uVar27];
          if ((pIVar23->super_ImGuiViewport).ID == IVar21) {
            if (((pIVar23->super_ImGuiViewport).Flags & 0x10) != 0) goto LAB_00152d94;
            goto LAB_00152e0f;
          }
          uVar27 = uVar27 + 1;
        } while (uVar40 != uVar27);
      }
LAB_0015312e:
      local_80 = pIVar31->MouseLastHoveredViewport;
      bVar41 = true;
      if (local_80 == (ImGuiViewportP *)0x0) {
        local_80 = *(pIVar31->Viewports).Data;
        pIVar31->MouseLastHoveredViewport = local_80;
      }
      pIVar23 = (ImGuiViewportP *)0x0;
    }
    ppIVar34 = &pIVar31->MovingWindow->Viewport;
    if (pIVar31->MovingWindow == (ImGuiWindow *)0x0) {
      ppIVar34 = &pIVar31->MouseLastHoveredViewport;
    }
    if (pIVar31->DragDropActive == false) {
      local_80 = pIVar23;
    }
    if (!bVar41) {
      local_80 = pIVar23;
    }
    pIVar23 = *ppIVar34;
    pIVar31->MouseViewport = pIVar23;
    if ((pIVar31->DragDropActive == false) && (pIVar31->ActiveId != 0)) {
      if ((GImGui->IO).MouseDown[0] == false) {
        uVar40 = 0;
        do {
          uVar27 = uVar40;
          if (uVar27 == 4) break;
          uVar40 = uVar27 + 1;
        } while ((GImGui->IO).MouseDown[uVar27 + 1] != true);
        if (3 < uVar27) goto LAB_001531d2;
      }
    }
    else {
LAB_001531d2:
      if (((local_80 != (ImGuiViewportP *)0x0) && (local_80 != pIVar23)) &&
         (((local_80->super_ImGuiViewport).Flags & 0x10) == 0)) goto LAB_00152ce4;
    }
  }
  ((ctx->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    font = *(((GImGui->IO).Fonts)->Fonts).Data;
  }
  SetCurrentFont(font);
  iVar18 = (ctx->Viewports).Size;
  if ((long)iVar18 < 1) {
    fVar47 = 3.4028235e+38;
    fVar58 = 3.4028235e+38;
    fVar60 = -3.4028235e+38;
    fVar48 = -3.4028235e+38;
  }
  else {
    fVar47 = 3.4028235e+38;
    fVar58 = 3.4028235e+38;
    fVar48 = -3.4028235e+38;
    lVar26 = 0;
    do {
      pIVar23 = (ctx->Viewports).Data[lVar26];
      IVar49 = (pIVar23->super_ImGuiViewport).Pos;
      IVar61 = (pIVar23->super_ImGuiViewport).Size;
      fVar53 = IVar49.x;
      fVar60 = IVar61.x + fVar53;
      fVar57 = IVar49.y;
      fVar63 = IVar61.y + fVar57;
      uVar15 = -(uint)(fVar48 < fVar63);
      fVar60 = (float)((uint)fVar60 & -(uint)(0.0 < fVar60));
      fVar47 = (float)(~-(uint)(fVar53 < fVar47) & (uint)fVar47 |
                      (uint)fVar53 & -(uint)(fVar53 < fVar47));
      fVar58 = (float)(~-(uint)(fVar57 < fVar58) & (uint)fVar58 |
                      (uint)fVar57 & -(uint)(fVar57 < fVar58));
      fVar48 = (float)(~uVar15 & (uint)fVar48 | (uint)fVar63 & uVar15);
      lVar26 = lVar26 + 1;
    } while (iVar18 != lVar26);
  }
  (ctx->DrawListSharedData).ClipRectFullscreen.x = fVar47;
  (ctx->DrawListSharedData).ClipRectFullscreen.y = fVar58;
  (ctx->DrawListSharedData).ClipRectFullscreen.z = fVar60;
  (ctx->DrawListSharedData).ClipRectFullscreen.w = fVar48;
  (ctx->DrawListSharedData).CurveTessellationTol = (ctx->Style).CurveTessellationTol;
  bVar41 = (ctx->Style).AntiAliasedLines;
  uVar15 = (uint)bVar41;
  (ctx->DrawListSharedData).InitialFlags = (uint)bVar41;
  if ((ctx->Style).AntiAliasedFill != false) {
    uVar15 = bVar41 | 2;
    (ctx->DrawListSharedData).InitialFlags = uVar15;
  }
  if (((ctx->IO).BackendFlags & 8) != 0) {
    (ctx->DrawListSharedData).InitialFlags = uVar15 | 4;
  }
  if (0 < iVar18) {
    lVar26 = 0;
    do {
      pIVar23 = (ctx->Viewports).Data[lVar26];
      (pIVar23->super_ImGuiViewport).DrawData = (ImDrawData *)0x0;
      (pIVar23->DrawDataP).Valid = false;
      (pIVar23->DrawDataP).OwnerViewport = (ImGuiViewport *)0x0;
      (pIVar23->DrawDataP).CmdLists = (ImDrawList **)0x0;
      (pIVar23->DrawDataP).CmdListsCount = 0;
      (pIVar23->DrawDataP).TotalIdxCount = 0;
      (pIVar23->DrawDataP).TotalVtxCount = 0;
      (pIVar23->DrawDataP).DisplayPos.x = 0.0;
      *(undefined8 *)&(pIVar23->DrawDataP).DisplayPos.y = 0;
      (pIVar23->DrawDataP).DisplaySize.x = 0.0;
      (pIVar23->DrawDataP).DisplaySize.y = 0.0;
      (pIVar23->DrawDataP).FramebufferScale.x = 0.0;
      (pIVar23->DrawDataP).FramebufferScale.y = 0.0;
      lVar26 = lVar26 + 1;
    } while (lVar26 < (ctx->Viewports).Size);
  }
  pIVar31 = GImGui;
  if ((ctx->DragDropActive != false) &&
     (IVar21 = (ctx->DragDropPayload).SourceId, IVar21 == ctx->ActiveId)) {
    if (GImGui->ActiveId == IVar21) {
      GImGui->ActiveIdIsAlive = IVar21;
    }
    if (pIVar31->ActiveIdPreviousFrame == IVar21) {
      pIVar31->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (ctx->HoveredIdPreviousFrame == 0) {
    IVar21 = ctx->HoveredId;
    ctx->HoveredIdTimer = 0.0;
    ctx->HoveredIdNotActiveTimer = 0.0;
    if (IVar21 != 0) goto LAB_00152f30;
LAB_00152f57:
    IVar21 = 0;
    IVar16 = ctx->ActiveId;
  }
  else {
    IVar21 = ctx->HoveredId;
    if (IVar21 == 0) goto LAB_00152f57;
    if (ctx->ActiveId == IVar21) {
      ctx->HoveredIdNotActiveTimer = 0.0;
    }
LAB_00152f30:
    fVar47 = (ctx->IO).DeltaTime;
    ctx->HoveredIdTimer = ctx->HoveredIdTimer + fVar47;
    IVar16 = IVar21;
    if (ctx->ActiveId != IVar21) {
      ctx->HoveredIdNotActiveTimer = fVar47 + ctx->HoveredIdNotActiveTimer;
      IVar16 = ctx->ActiveId;
    }
  }
  ctx->HoveredIdPreviousFrame = IVar21;
  ctx->HoveredId = 0;
  ctx->HoveredIdAllowOverlap = false;
  if (((ctx->ActiveIdIsAlive != IVar16) && (IVar16 != 0)) && (ctx->ActiveIdPreviousFrame == IVar16))
  {
    SetActiveID(0,(ImGuiWindow *)0x0);
    IVar16 = ctx->ActiveId;
  }
  fVar47 = (ctx->IO).DeltaTime;
  if (IVar16 != 0) {
    ctx->ActiveIdTimer = ctx->ActiveIdTimer + fVar47;
  }
  ctx->LastActiveIdTimer = ctx->LastActiveIdTimer + fVar47;
  ctx->ActiveIdPreviousFrame = IVar16;
  ctx->ActiveIdPreviousFrameWindow = ctx->ActiveIdWindow;
  ctx->ActiveIdPreviousFrameHasBeenEditedBefore = ctx->ActiveIdHasBeenEditedBefore;
  ctx->ActiveIdIsAlive = 0;
  ctx->ActiveIdHasBeenEditedThisFrame = false;
  ctx->ActiveIdPreviousFrameIsAlive = false;
  ctx->ActiveIdIsJustActivated = false;
  if (ctx->TempInputTextId == 0) {
LAB_00153032:
    if (IVar16 == 0) {
      ctx->ActiveIdUsingNavDirMask = 0;
      ctx->ActiveIdUsingNavInputMask = 0;
      ctx->ActiveIdUsingKeyInputMask = 0;
    }
  }
  else if (IVar16 != ctx->TempInputTextId) {
    ctx->TempInputTextId = 0;
    goto LAB_00153032;
  }
  ctx->DragDropAcceptIdPrev = ctx->DragDropAcceptIdCurr;
  ctx->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  ctx->DragDropAcceptIdCurr = 0;
  ctx->DragDropWithinSourceOrTarget = false;
  memcpy((ctx->IO).KeysDownDurationPrev,(ctx->IO).KeysDownDuration,0x800);
  lVar26 = 0x148;
  do {
    fVar58 = -1.0;
    if (*(char *)((long)(ctx->IO).KeyMap + lVar26 + -0x3c) == '\x01') {
      fVar48 = *(float *)((long)ctx + lVar26 * 4 + -0x80);
      fVar58 = 0.0;
      if (0.0 <= fVar48) {
        fVar58 = fVar48 + fVar47;
      }
    }
    *(float *)((long)ctx + lVar26 * 4 + -0x80) = fVar58;
    pIVar31 = GImGui;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0x348);
  (GImGui->IO).WantSetMousePos = false;
  uVar15 = (pIVar31->IO).ConfigFlags;
  if (((uVar15 & 2) == 0) || (((pIVar31->IO).BackendFlags & 1) == 0)) {
    bVar37 = 0;
  }
  else if ((((0.0 < (pIVar31->IO).NavInputs[0]) || (0.0 < (pIVar31->IO).NavInputs[2])) ||
           (0.0 < (pIVar31->IO).NavInputs[1])) || (bVar37 = 1, 0.0 < (pIVar31->IO).NavInputs[3])) {
    pIVar31->NavInputSource = ImGuiInputSource_NavGamepad;
    bVar37 = 1;
  }
  if ((uVar15 & 1) != 0) {
    lVar26 = (long)(pIVar31->IO).KeyMap[0xc];
    if ((-1 < lVar26) && ((pIVar31->IO).KeysDown[lVar26] == true)) {
      (pIVar31->IO).NavInputs[0] = 1.0;
      pIVar31->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar26 = (long)(pIVar31->IO).KeyMap[0xd];
    if ((-1 < lVar26) && ((pIVar31->IO).KeysDown[lVar26] == true)) {
      (pIVar31->IO).NavInputs[2] = 1.0;
      pIVar31->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar26 = (long)(pIVar31->IO).KeyMap[0xe];
    if ((-1 < lVar26) && ((pIVar31->IO).KeysDown[lVar26] == true)) {
      (pIVar31->IO).NavInputs[1] = 1.0;
      pIVar31->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar26 = (long)(pIVar31->IO).KeyMap[1];
    if ((-1 < lVar26) && ((pIVar31->IO).KeysDown[lVar26] == true)) {
      (pIVar31->IO).NavInputs[0x11] = 1.0;
      pIVar31->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar26 = (long)(pIVar31->IO).KeyMap[2];
    if ((-1 < lVar26) && ((pIVar31->IO).KeysDown[lVar26] == true)) {
      (pIVar31->IO).NavInputs[0x12] = 1.0;
      pIVar31->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar26 = (long)(pIVar31->IO).KeyMap[3];
    if ((-1 < lVar26) && ((pIVar31->IO).KeysDown[lVar26] == true)) {
      (pIVar31->IO).NavInputs[0x13] = 1.0;
      pIVar31->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    lVar26 = (long)(pIVar31->IO).KeyMap[4];
    if ((-1 < lVar26) && ((pIVar31->IO).KeysDown[lVar26] == true)) {
      (pIVar31->IO).NavInputs[0x14] = 1.0;
      pIVar31->NavInputSource = ImGuiInputSource_NavKeyboard;
    }
    bVar41 = (pIVar31->IO).KeyCtrl;
    if (bVar41 == true) {
      (pIVar31->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar31->IO).KeyShift == true) {
      (pIVar31->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar41 == false) && ((pIVar31->IO).KeyAlt != false)) {
      (pIVar31->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar30 = (pIVar31->IO).NavInputsDownDuration;
  pfVar35 = (pIVar31->IO).NavInputsDownDurationPrev;
  for (lVar26 = 0x15; lVar26 != 0; lVar26 = lVar26 + -1) {
    *pfVar35 = *pfVar30;
    pfVar30 = pfVar30 + (ulong)bVar44 * -2 + 1;
    pfVar35 = pfVar35 + (ulong)bVar44 * -2 + 1;
  }
  lVar26 = 0x528;
  do {
    fVar47 = -1.0;
    if (0.0 < *(float *)((long)pIVar31 + lVar26 * 4 + -0x1158)) {
      fVar58 = (float)(pIVar31->IO).KeyMap[lVar26 + -0xf];
      fVar47 = 0.0;
      if (0.0 <= fVar58) {
        fVar47 = fVar58 + (pIVar31->IO).DeltaTime;
      }
    }
    (pIVar31->IO).KeyMap[lVar26 + -0xf] = (int)fVar47;
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0x53d);
  IVar21 = pIVar31->NavInitResultId;
  if ((IVar21 != 0) &&
     (((pIVar31->NavDisableHighlight != true || (pIVar31->NavInitRequestFromMove == true)) &&
      (pIVar19 = pIVar31->NavWindow, pIVar19 != (ImGuiWindow *)0x0)))) {
    IVar32 = pIVar31->NavLayer;
    if (pIVar31->NavInitRequestFromMove == true) {
      pIVar31->NavId = IVar21;
      pIVar19->NavLastIds[(int)IVar32] = IVar21;
      IVar49 = (pIVar31->NavInitResultRectRel).Max;
      pIVar19->NavRectRel[(int)IVar32].Min = (pIVar31->NavInitResultRectRel).Min;
      (&pIVar19->NavRectRel[(int)IVar32].Min)[1] = IVar49;
      pIVar31->NavMousePosDirty = true;
      pIVar31->NavDisableHighlight = false;
      pIVar31->NavDisableMouseHover = true;
      pIVar19 = pIVar31->NavWindow;
      IVar32 = pIVar31->NavLayer;
    }
    else {
      pIVar31->NavId = IVar21;
      pIVar19->NavLastIds[(int)IVar32] = IVar21;
    }
    IVar49 = (pIVar31->NavInitResultRectRel).Max;
    pIVar19->NavRectRel[IVar32].Min = (pIVar31->NavInitResultRectRel).Min;
    (&pIVar19->NavRectRel[IVar32].Min)[1] = IVar49;
  }
  pIVar31->NavInitRequest = false;
  pIVar31->NavInitRequestFromMove = false;
  pIVar31->NavInitResultId = 0;
  pIVar31->NavJustMovedToId = 0;
  pIVar39 = pIVar31;
  if (pIVar31->NavMoveRequest == true) {
    IVar21 = (pIVar31->NavMoveResultLocal).ID;
    if ((IVar21 == 0) && ((pIVar31->NavMoveResultOther).ID == 0)) {
      if (pIVar31->NavId != 0) {
        pIVar31->NavDisableHighlight = false;
        pIVar31->NavDisableMouseHover = true;
      }
    }
    else {
      pIVar3 = &pIVar31->NavMoveResultOther;
      pIVar38 = &pIVar31->NavMoveResultLocal;
      if (IVar21 == 0) {
        pIVar38 = pIVar3;
      }
      if ((((pIVar31->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar21 = (pIVar31->NavMoveResultLocalVisibleSet).ID, IVar21 != 0)) &&
         (IVar21 != pIVar31->NavId)) {
        pIVar38 = &pIVar31->NavMoveResultLocalVisibleSet;
      }
      if (pIVar38 == pIVar3) {
LAB_001535d7:
        pIVar38 = pIVar3;
      }
      else if ((pIVar3->ID != 0) &&
              (((pIVar31->NavMoveResultOther).Window)->ParentWindow == pIVar31->NavWindow)) {
        fVar47 = (pIVar31->NavMoveResultOther).DistBox;
        fVar58 = pIVar38->DistBox;
        if (fVar58 <= fVar47) {
          if (((fVar47 != fVar58) || (NAN(fVar47) || NAN(fVar58))) ||
             (pfVar30 = &(pIVar31->NavMoveResultOther).DistCenter,
             pIVar38->DistCenter < *pfVar30 || pIVar38->DistCenter == *pfVar30)) goto LAB_001535da;
        }
        goto LAB_001535d7;
      }
LAB_001535da:
      if (pIVar31->NavLayer == ImGuiNavLayer_Main) {
        if ((pIVar31->NavMoveRequestFlags & 0x40U) == 0) {
          IVar49 = pIVar38->Window->Pos;
          IVar61 = (pIVar38->RectRel).Min;
          fVar47 = IVar49.x;
          local_50.Min.x = IVar61.x + fVar47;
          fVar58 = IVar49.y;
          local_50.Min.y = IVar61.y + fVar58;
          IVar49 = (pIVar38->RectRel).Max;
          local_50.Max.x = IVar49.x + fVar47;
          local_50.Max.y = IVar49.y + fVar58;
          IVar49 = ScrollToBringRectIntoView(pIVar38->Window,&local_50);
        }
        else {
          pIVar19 = pIVar38->Window;
          fVar47 = 0.0;
          if (pIVar31->NavMoveDir == 2) {
            fVar47 = (pIVar19->ScrollMax).y;
          }
          IVar49 = (ImVec2)((ulong)(uint)((pIVar19->Scroll).y - fVar47) << 0x20);
          (pIVar19->ScrollTarget).y = fVar47;
          (pIVar19->ScrollTargetCenterRatio).y = 0.0;
        }
        fVar47 = (pIVar38->RectRel).Min.y;
        fVar58 = (pIVar38->RectRel).Max.x;
        fVar48 = (pIVar38->RectRel).Max.y;
        (pIVar38->RectRel).Min.x = (pIVar38->RectRel).Min.x - IVar49.x;
        (pIVar38->RectRel).Min.y = fVar47 - IVar49.y;
        (pIVar38->RectRel).Max.x = fVar58 - IVar49.x;
        (pIVar38->RectRel).Max.y = fVar48 - IVar49.y;
      }
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar31->NavWindow = pIVar38->Window;
      IVar21 = pIVar38->ID;
      if (pIVar31->NavId != IVar21) {
        pIVar31->NavJustMovedToId = IVar21;
        pIVar31->NavJustMovedToMultiSelectScopeId = pIVar38->SelectScopeId;
      }
      pIVar39 = GImGui;
      IVar32 = pIVar31->NavLayer;
      GImGui->NavId = IVar21;
      pIVar19 = pIVar39->NavWindow;
      pIVar19->NavLastIds[(int)IVar32] = IVar21;
      IVar49 = (pIVar38->RectRel).Max;
      pIVar1 = &pIVar19->NavRectRel[(int)IVar32].Min;
      *pIVar1 = (pIVar38->RectRel).Min;
      pIVar1[1] = IVar49;
      pIVar39->NavMousePosDirty = true;
      pIVar39->NavDisableHighlight = false;
      pIVar39->NavDisableMouseHover = true;
      pIVar31->NavMoveFromClampedRefRect = false;
    }
  }
  if (pIVar31->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (((pIVar31->NavMoveResultLocal).ID == 0) && ((pIVar31->NavMoveResultOther).ID == 0)) {
      pIVar31->NavDisableHighlight = false;
    }
    pIVar31->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar31->NavMousePosDirty == true) && (pIVar31->NavIdIsAlive == true)) {
    if ((((pIVar31->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar31->IO).BackendFlags & 4) != 0 && (pIVar31->NavDisableHighlight == false)) &&
         (pIVar31->NavDisableMouseHover == true)) && (pIVar31->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar49 = NavCalcPreferredRefPos();
      (pIVar31->IO).MousePosPrev = IVar49;
      (pIVar31->IO).MousePos = IVar49;
      (pIVar31->IO).WantSetMousePos = true;
    }
    pIVar31->NavMousePosDirty = false;
  }
  pIVar31->NavIdIsAlive = false;
  pIVar31->NavJustTabbedId = 0;
  pIVar19 = pIVar31->NavWindow;
  pIVar24 = pIVar19;
  if (pIVar19 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar24->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar24 != pIVar19) {
          pIVar24->NavLastChildNavWindow = pIVar19;
        }
        break;
      }
      ppIVar8 = &pIVar24->ParentWindow;
      pIVar24 = *ppIVar8;
    } while (*ppIVar8 != (ImGuiWindow *)0x0);
    if ((pIVar19->NavLastChildNavWindow != (ImGuiWindow *)0x0) &&
       (pIVar31->NavLayer == ImGuiNavLayer_Main)) {
      pIVar19->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar19 = GetTopMostPopupModal();
  if (pIVar19 == (ImGuiWindow *)0x0) {
    if (pIVar39->NavWindowingTargetAnim == (ImGuiWindow *)0x0) {
      if (pIVar39->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_00153899;
LAB_0015396a:
      fVar47 = (pIVar39->IO).DeltaTime + pIVar39->NavWindowingTimer;
      pIVar39->NavWindowingTimer = fVar47;
      IVar22 = pIVar39->NavInputSource;
      pIVar20 = pIVar39;
      if (IVar22 != ImGuiInputSource_NavGamepad) {
LAB_00153ab9:
        if (IVar22 == ImGuiInputSource_NavKeyboard) {
          fVar58 = (pIVar39->NavWindowingTimer + -0.2) / 0.05;
          fVar47 = 1.0;
          if (fVar58 <= 1.0) {
            fVar47 = fVar58;
          }
          fVar47 = (float)(~-(uint)(fVar58 < 0.0) & (uint)fVar47);
          uVar46 = -(uint)(fVar47 <= pIVar39->NavWindowingHighlightAlpha);
          pIVar39->NavWindowingHighlightAlpha =
               (float)(uVar46 & (uint)pIVar39->NavWindowingHighlightAlpha | ~uVar46 & (uint)fVar47);
          iVar18 = (pIVar20->IO).KeyMap[0];
          if ((-1 < iVar18) && (bVar41 = IsKeyPressed(iVar18,true), bVar41)) {
            NavUpdateWindowingHighlightWindow((pIVar39->IO).KeyShift - 1 | 1);
          }
          if ((pIVar39->IO).KeyCtrl == false) {
            pIVar19 = pIVar39->NavWindowingTarget;
            bVar41 = false;
            goto LAB_00153ba6;
          }
        }
        goto LAB_00153b49;
      }
      fVar58 = (fVar47 + -0.2) / 0.05;
      fVar47 = 1.0;
      if (fVar58 <= 1.0) {
        fVar47 = fVar58;
      }
      fVar47 = (float)(~-(uint)(fVar58 < 0.0) & (uint)fVar47);
      uVar46 = -(uint)(fVar47 <= pIVar39->NavWindowingHighlightAlpha);
      fVar48 = (float)(uVar46 & (uint)pIVar39->NavWindowingHighlightAlpha | ~uVar46 & (uint)fVar47);
      pIVar39->NavWindowingHighlightAlpha = fVar48;
      fVar47 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
      fVar58 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
      iVar18 = (uint)(0.0 < fVar47) - (uint)(0.0 < fVar58);
      if (iVar18 != 0) {
        NavUpdateWindowingHighlightWindow(iVar18);
        pIVar39->NavWindowingHighlightAlpha = 1.0;
        fVar48 = 1.0;
        pIVar20 = GImGui;
      }
      if (0.0 < (pIVar20->IO).NavInputs[3]) {
        if (pIVar39->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_00153b49;
        IVar22 = pIVar39->NavInputSource;
        goto LAB_00153ab9;
      }
      pbVar36 = &pIVar39->NavWindowingToggleLayer;
      *pbVar36 = (bool)(*pbVar36 & fVar48 < 1.0);
      if (*pbVar36 == false) {
        pIVar19 = pIVar39->NavWindowingTarget;
        bVar41 = false;
      }
      else {
        bVar41 = pIVar39->NavWindow != (ImGuiWindow *)0x0;
        pIVar19 = (ImGuiWindow *)0x0;
      }
      pIVar39->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    else {
      if (pIVar39->NavWindowingTarget != (ImGuiWindow *)0x0) goto LAB_0015396a;
      fVar47 = (pIVar39->IO).DeltaTime * -10.0 + pIVar39->NavWindowingHighlightAlpha;
      fVar47 = (float)(-(uint)(0.0 <= fVar47) & (uint)fVar47);
      pIVar39->NavWindowingHighlightAlpha = fVar47;
      if ((pIVar39->DimBgRatio <= 0.0) && (fVar47 <= 0.0)) {
        pIVar39->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
      }
LAB_00153899:
      fVar47 = (pIVar39->IO).NavInputsDownDuration[3];
      if ((((pIVar39->IO).KeyCtrl == true) && (iVar18 = (pIVar39->IO).KeyMap[0], -1 < iVar18)) &&
         (bVar41 = IsKeyPressed(iVar18,true), bVar41)) {
        bVar44 = (byte)(pIVar39->IO).ConfigFlags;
        uVar46 = (uint)bVar44;
        if (fVar47 == 0.0 || (bVar44 & 1) != 0) {
LAB_00153901:
          pIVar19 = pIVar39->NavWindow;
          if ((pIVar19 != (ImGuiWindow *)0x0) ||
             (pIVar19 = FindWindowNavFocusable
                                  ((pIVar39->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
             pIVar19 != (ImGuiWindow *)0x0)) {
            pIVar39->NavWindowingTargetAnim = pIVar19;
            pIVar39->NavWindowingTarget = pIVar19;
            pIVar39->NavWindowingTimer = 0.0;
            pIVar39->NavWindowingHighlightAlpha = 0.0;
            pIVar39->NavWindowingToggleLayer = (bool)(~(byte)uVar46 & 1);
            pIVar39->NavInputSource = ImGuiInputSource_NavGamepad - (uVar46 & 1);
            goto LAB_0015396a;
          }
        }
      }
      else if ((fVar47 == 0.0) && (!NAN(fVar47))) {
        uVar46 = 0;
        goto LAB_00153901;
      }
      pIVar39->NavWindowingTimer = (pIVar39->IO).DeltaTime + pIVar39->NavWindowingTimer;
LAB_00153b49:
      bVar41 = false;
      pIVar19 = (ImGuiWindow *)0x0;
    }
LAB_00153ba6:
    pIVar20 = GImGui;
    fVar47 = (GImGui->IO).NavInputsDownDuration[0x10];
    if ((fVar47 == 0.0) && (!NAN(fVar47))) {
      pIVar39->NavWindowingToggleLayer = true;
    }
    if ((((pIVar39->ActiveId == 0) || (pIVar39->ActiveIdAllowOverlap == true)) && (fVar47 < 0.0)) &&
       ((pIVar39->NavWindowingToggleLayer != false &&
        (0.0 <= (pIVar20->IO).NavInputsDownDurationPrev[0x10])))) {
      bVar41 = (bool)(((pIVar39->IO).MousePosPrev.y < -256000.0 ||
                      (pIVar39->IO).MousePosPrev.x < -256000.0) !=
                      (-256000.0 <= (pIVar39->IO).MousePos.x &&
                      -256000.0 <= (pIVar39->IO).MousePos.y) | bVar41);
    }
    pIVar24 = pIVar39->NavWindowingTarget;
    if ((pIVar24 != (ImGuiWindow *)0x0) && ((pIVar24->Flags & 4) == 0)) {
      IVar22 = pIVar39->NavInputSource;
      if ((IVar22 == ImGuiInputSource_NavGamepad) ||
         ((IVar49.x = 0.0, IVar49.y = 0.0, IVar22 == ImGuiInputSource_NavKeyboard &&
          (IVar22 = ImGuiInputSource_Mouse, (pIVar39->IO).KeyShift == false)))) {
        IVar49 = GetNavInputAmount2d(IVar22,ImGuiInputReadMode_Down,0.0,0.0);
      }
      fVar47 = IVar49.y;
      if (((IVar49.x != 0.0) || (fVar47 != 0.0)) || (NAN(fVar47))) {
        fVar58 = (pIVar39->IO).DisplayFramebufferScale.x;
        fVar48 = (pIVar39->IO).DisplayFramebufferScale.y;
        if (fVar48 <= fVar58) {
          fVar58 = fVar48;
        }
        fVar58 = (float)(int)(fVar58 * (pIVar39->IO).DeltaTime * 800.0);
        IVar61 = pIVar24->RootWindow->Pos;
        local_50.Min.x = IVar61.x + IVar49.x * fVar58;
        local_50.Min.y = IVar61.y + fVar47 * fVar58;
        SetWindowPos(pIVar24->RootWindow,&local_50.Min,1);
        pIVar39->NavDisableMouseHover = true;
        if (((pIVar39->NavWindowingTarget->Flags & 0x100) == 0) &&
           (GImGui->SettingsDirtyTimer <= 0.0)) {
          GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
        }
      }
    }
    if (pIVar19 != (ImGuiWindow *)0x0) {
      pIVar24 = pIVar39->NavWindow;
      if (pIVar24 == (ImGuiWindow *)0x0) {
        pIVar23 = (ImGuiViewportP *)0x0;
LAB_00153d99:
        SetActiveID(0,(ImGuiWindow *)0x0);
        pIVar39->NavDisableHighlight = false;
        pIVar39->NavDisableMouseHover = true;
        pIVar19 = NavRestoreLastChildNavWindow(pIVar19);
        ClosePopupsOverWindow(pIVar19,false);
        FocusWindow(pIVar19);
        if (pIVar19->NavLastIds[0] == 0) {
          NavInitWindow(pIVar19,false);
        }
        if ((pIVar19->DC).NavLayerActiveMask == 2) {
          pIVar39->NavLayer = ImGuiNavLayer_Menu;
        }
        if ((pIVar19->Viewport != pIVar23) &&
           (p_Var11 = (pIVar39->PlatformIO).Platform_SetWindowFocus,
           p_Var11 != (_func_void_ImGuiViewport_ptr *)0x0)) {
          (*p_Var11)(&pIVar19->Viewport->super_ImGuiViewport);
        }
      }
      else if (pIVar19 != pIVar24->RootWindowDockStop) {
        pIVar23 = pIVar24->Viewport;
        goto LAB_00153d99;
      }
      pIVar39->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((bVar41) && (pIVar19 = pIVar39->NavWindow, pIVar24 = pIVar19, pIVar19 != (ImGuiWindow *)0x0)
       ) {
      while (window = pIVar24, window->ParentWindow != (ImGuiWindow *)0x0) {
        if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
           (pIVar24 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
      }
      if (window != pIVar19) {
        FocusWindow(window);
        window->NavLastChildNavWindow = pIVar19;
        pIVar19 = pIVar39->NavWindow;
      }
      pIVar39->NavDisableHighlight = false;
      pIVar39->NavDisableMouseHover = true;
      IVar32 = ImGuiNavLayer_Main;
      if (((pIVar19->DC).NavLayerActiveMask & 2) != 0) {
        if (pIVar39->NavLayer == ImGuiNavLayer_Main) {
          IVar32 = ImGuiNavLayer_Menu;
          if (window->DockNodeAsHost == (ImGuiDockNode *)0x0) {
            pIVar19->NavLastIds[1] = 0;
          }
        }
        else {
          IVar32 = pIVar39->NavLayer ^ ImGuiNavLayer_Menu;
        }
      }
      NavRestoreLayer(IVar32);
    }
  }
  else {
    pIVar39->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if (((bool)((uVar15 & 1) == 0 & (bVar37 ^ 1))) || (pIVar31->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar31->IO).NavActive = false;
LAB_00153f22:
    bVar41 = pIVar31->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar41 = (pIVar31->NavWindow->Flags & 0x40000U) == 0;
    (pIVar31->IO).NavActive = bVar41;
    if (((!bVar41) || (pIVar31->NavId == 0)) ||
       (bVar41 = true, pIVar31->NavDisableHighlight != false)) goto LAB_00153f22;
  }
  (pIVar31->IO).NavVisible = bVar41;
  fVar47 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar47 == 0.0) && (!NAN(fVar47))) {
    if (pIVar31->ActiveId == 0) {
      pIVar19 = pIVar31->NavWindow;
      if (((pIVar19 == (ImGuiWindow *)0x0) || ((pIVar19->Flags & 0x5000000U) != 0x1000000)) ||
         ((pIVar19->ParentWindow == (ImGuiWindow *)0x0 || (pIVar19 == pIVar19->RootWindowDockStop)))
         ) {
        iVar18 = (pIVar31->OpenPopupStack).Size;
        if ((long)iVar18 < 1) {
          if (pIVar31->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar19 != (ImGuiWindow *)0x0) && ((pIVar19->Flags & 0x5000000U) != 0x1000000)) {
              pIVar19->NavLastIds[0] = 0;
            }
            pIVar31->NavId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar31->OpenPopupStack).Data[(long)iVar18 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar18 + -1,true);
        }
      }
      else {
        FocusWindow(pIVar19->ParentWindow);
        pIVar39 = GImGui;
        IVar21 = pIVar19->ChildId;
        GImGui->NavId = IVar21;
        pIVar39->NavWindow->NavLastIds[0] = IVar21;
        pIVar31->NavIdIsAlive = false;
        if (pIVar31->NavDisableMouseHover == true) {
          pIVar31->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
  }
  pIVar31->NavActivateId = 0;
  pIVar31->NavActivateDownId = 0;
  pIVar31->NavActivatePressedId = 0;
  pIVar39 = GImGui;
  pIVar31->NavInputId = 0;
  IVar21 = pIVar31->NavId;
  if (((IVar21 == 0) || (pIVar31->NavDisableHighlight != false)) ||
     (pIVar31->NavWindowingTarget != (ImGuiWindow *)0x0)) {
LAB_001540a8:
    pIVar19 = pIVar31->NavWindow;
    if (pIVar19 == (ImGuiWindow *)0x0) goto LAB_00154111;
    if ((pIVar19->Flags & 0x40000) != 0) {
      pIVar31->NavDisableHighlight = true;
    }
    bVar41 = false;
  }
  else {
    if (pIVar31->NavWindow != (ImGuiWindow *)0x0) {
      if ((pIVar31->NavWindow->Flags & 0x40000) == 0) {
        if (0.0 < (GImGui->IO).NavInputs[0]) {
          fVar47 = (GImGui->IO).NavInputsDownDuration[0];
          if (0.0 <= fVar47) {
            IVar16 = pIVar31->ActiveId;
            if (IVar16 == 0 && fVar47 == 0.0) {
              pIVar31->NavActivateId = IVar21;
              pIVar31->NavActivateDownId = IVar21;
            }
            else {
              if ((IVar16 != 0) && (IVar16 != IVar21)) goto LAB_00154108;
              pIVar31->NavActivateDownId = IVar21;
              if ((fVar47 != 0.0) || (NAN(fVar47))) goto LAB_0015563f;
            }
            pIVar31->NavActivatePressedId = IVar21;
          }
          else {
            IVar16 = pIVar31->ActiveId;
            if ((IVar16 != 0) && (IVar16 != IVar21)) goto LAB_00154108;
            pIVar31->NavActivateDownId = IVar21;
          }
        }
        else {
          IVar16 = pIVar31->ActiveId;
          if (IVar16 != 0) {
LAB_00154108:
            if (IVar16 != IVar21) goto LAB_001540a8;
          }
        }
LAB_0015563f:
        fVar47 = (pIVar39->IO).NavInputsDownDuration[2];
        if ((fVar47 == 0.0) && (!NAN(fVar47))) {
          pIVar31->NavInputId = IVar21;
        }
      }
      goto LAB_001540a8;
    }
LAB_00154111:
    bVar41 = true;
    pIVar19 = (ImGuiWindow *)0x0;
  }
  pIVar31->NavMoveRequest = false;
  IVar16 = pIVar31->NavNextActivateId;
  if (IVar16 != 0) {
    pIVar31->NavActivateId = IVar16;
    pIVar31->NavActivateDownId = IVar16;
    pIVar31->NavActivatePressedId = IVar16;
    pIVar31->NavInputId = IVar16;
  }
  pIVar31->NavNextActivateId = 0;
  if (pIVar31->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar31->NavMoveDir = -1;
    pIVar31->NavMoveRequestFlags = 0;
    IVar29 = -1;
    if (((!bVar41) && (pIVar31->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar19->Flags & 0x40000) == 0)) {
      uVar46 = GImGui->ActiveIdUsingNavDirMask;
      IVar29 = -1;
      if (((uVar46 & 1) == 0) &&
         ((fVar47 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar47 ||
          (fVar47 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar47)))) {
        pIVar31->NavMoveDir = 0;
        IVar29 = 0;
      }
      if (((uVar46 & 2) == 0) &&
         ((fVar47 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar47 ||
          (fVar47 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar47)))) {
        pIVar31->NavMoveDir = 1;
        IVar29 = 1;
      }
      if (((uVar46 & 4) == 0) &&
         ((fVar47 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar47 ||
          (fVar47 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar47)))) {
        pIVar31->NavMoveDir = 2;
        IVar29 = 2;
      }
      if (((uVar46 & 8) == 0) &&
         ((fVar47 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar47 ||
          (fVar47 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat), 0.0 < fVar47)))) {
        pIVar31->NavMoveDir = 3;
        IVar29 = 3;
      }
    }
    pIVar31->NavMoveClipDir = IVar29;
  }
  else {
    pIVar31->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar39 = GImGui;
  fVar47 = 0.0;
  if ((((((uVar15 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
       (pIVar24 = GImGui->NavWindow, pIVar24 != (ImGuiWindow *)0x0)) &&
      (((pIVar24->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)))) &&
     (GImGui->NavLayer == ImGuiNavLayer_Main)) {
    local_38 = (long)(GImGui->IO).KeyMap[5];
    bVar43 = false;
    bVar42 = false;
    if ((-1 < local_38) && ((GImGui->IO).KeysDown[local_38] == true)) {
      bVar42 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    local_40 = (long)(GImGui->IO).KeyMap[6];
    if ((-1 < local_40) && ((GImGui->IO).KeysDown[local_40] == true)) {
      bVar43 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar13 = IsKeyPressed((GImGui->IO).KeyMap[7],true);
    if (bVar13) {
      bVar13 = (pIVar39->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar13 = false;
    }
    bVar14 = IsKeyPressed((pIVar39->IO).KeyMap[8],true);
    if (bVar14) {
      uVar25 = (undefined4)
               CONCAT71((int7)((ulong)extraout_RDX >> 8),
                        (pIVar39->ActiveIdUsingKeyInputMask & 0x100) == 0);
    }
    else {
      uVar25 = 0;
    }
    fVar47 = 0.0;
    if ((bVar42 != bVar43) || (bVar13 != SUB41(uVar25,0))) {
      if (((pIVar24->DC).NavLayerActiveMask == 0) && ((pIVar24->DC).NavHasScroll == true)) {
        bVar43 = IsKeyPressed((int)local_38,true);
        if (bVar43) {
          (pIVar24->ScrollTarget).y =
               (pIVar24->Scroll).y - ((pIVar24->InnerRect).Max.y - (pIVar24->InnerRect).Min.y);
LAB_0015590f:
          (pIVar24->ScrollTargetCenterRatio).y = 0.0;
        }
        else {
          bVar43 = IsKeyPressed((int)local_40,true);
          if (bVar43) {
            fVar47 = ((pIVar24->InnerRect).Max.y - (pIVar24->InnerRect).Min.y) + (pIVar24->Scroll).y
            ;
LAB_00155907:
            (pIVar24->ScrollTarget).y = fVar47;
            goto LAB_0015590f;
          }
          if (bVar13 == false) {
            if (SUB41(uVar25,0) != false) {
              fVar47 = (pIVar24->ScrollMax).y;
              goto LAB_00155907;
            }
          }
          else {
            (pIVar24->ScrollTarget).y = 0.0;
            (pIVar24->ScrollTargetCenterRatio).y = 0.0;
          }
        }
LAB_0015591b:
        fVar47 = 0.0;
      }
      else {
        fVar47 = pIVar39->FontBaseSize * pIVar24->FontWindowScale * pIVar24->FontDpiScale;
        if (pIVar24->ParentWindow != (ImGuiWindow *)0x0) {
          fVar47 = fVar47 * pIVar24->ParentWindow->FontWindowScale;
        }
        fVar47 = (pIVar24->NavRectRel[0].Max.y - pIVar24->NavRectRel[0].Min.y) +
                 (((pIVar24->InnerRect).Max.y - (pIVar24->InnerRect).Min.y) - fVar47);
        fVar47 = (float)(~-(uint)(fVar47 <= 0.0) & (uint)fVar47);
        local_54 = uVar25;
        bVar43 = IsKeyPressed((int)local_38,true);
        if (bVar43) {
          fVar47 = -fVar47;
          pIVar39->NavMoveDir = 3;
          pIVar39->NavMoveClipDir = 2;
          pIVar39->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar43 = IsKeyPressed((int)local_40,true);
          if (bVar43) {
            pIVar39->NavMoveDir = 2;
            pIVar39->NavMoveClipDir = 3;
            pIVar39->NavMoveRequestFlags = 0x30;
          }
          else {
            if (bVar13 != false) {
              fVar47 = -(pIVar24->Scroll).y;
              pIVar24->NavRectRel[0].Max.y = fVar47;
              pIVar24->NavRectRel[0].Min.y = fVar47;
              fVar47 = pIVar24->NavRectRel[0].Min.x;
              pIVar1 = &pIVar24->NavRectRel[0].Max;
              if (pIVar1->x <= fVar47 && fVar47 != pIVar1->x) {
                pIVar24->NavRectRel[0].Max.x = 0.0;
                pIVar24->NavRectRel[0].Min.x = 0.0;
              }
              pIVar39->NavMoveDir = 3;
              pIVar39->NavMoveRequestFlags = 0x50;
              goto LAB_0015591b;
            }
            fVar47 = 0.0;
            if ((char)local_54 != '\0') {
              fVar58 = ((pIVar24->ScrollMax).y + (pIVar24->SizeFull).y) - (pIVar24->Scroll).y;
              pIVar24->NavRectRel[0].Max.y = fVar58;
              pIVar24->NavRectRel[0].Min.y = fVar58;
              fVar58 = pIVar24->NavRectRel[0].Min.x;
              pIVar1 = &pIVar24->NavRectRel[0].Max;
              if (pIVar1->x <= fVar58 && fVar58 != pIVar1->x) {
                pIVar24->NavRectRel[0].Max.x = 0.0;
                pIVar24->NavRectRel[0].Min.x = 0.0;
              }
              pIVar39->NavMoveDir = 2;
              pIVar39->NavMoveRequestFlags = 0x50;
            }
          }
        }
      }
    }
  }
  uVar15 = pIVar31->NavMoveDir;
  if (uVar15 == 0xffffffff) {
    bVar44 = 0;
  }
  else {
    pIVar31->NavMoveRequest = true;
    pIVar31->NavMoveDirLast = uVar15;
    bVar44 = 1;
    if (IVar21 == 0) {
      pIVar31->NavInitRequest = true;
      pIVar31->NavInitRequestFromMove = true;
      pIVar31->NavInitResultId = 0;
      pIVar31->NavDisableHighlight = false;
    }
  }
  pIVar39 = GImGui;
  bVar43 = true;
  if (GImGui->NavMoveRequest == false) {
    bVar43 = GImGui->NavInitRequest;
  }
  GImGui->NavAnyRequest = bVar43;
  if (((!bVar41) && ((pIVar19->Flags & 0x40000) == 0)) &&
     (pIVar31->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar58 = pIVar39->FontBaseSize * pIVar19->FontWindowScale * pIVar19->FontDpiScale;
    if (pIVar19->ParentWindow != (ImGuiWindow *)0x0) {
      fVar58 = fVar58 * pIVar19->ParentWindow->FontWindowScale;
    }
    fVar58 = (float)(int)(fVar58 * 100.0 * (pIVar31->IO).DeltaTime + 0.5);
    if (((pIVar19->DC).NavLayerActiveMask == 0) && ((bVar44 & (pIVar19->DC).NavHasScroll) == 1)) {
      if (uVar15 < 2) {
        lVar26 = 0x9c;
        lVar33 = 0x94;
        uVar46 = 0;
        lVar28 = 0x84;
      }
      else {
        if ((uVar15 & 0xfffffffe) != 2) goto LAB_001545bb;
        lVar26 = 0xa0;
        lVar33 = 0x98;
        uVar46 = 2;
        lVar28 = 0x88;
      }
      *(float *)((long)&pIVar19->Name + lVar33) =
           (float)(int)(*(float *)(&DAT_0021dda0 + (ulong)(uVar15 == uVar46) * 4) * fVar58 +
                       *(float *)((long)&pIVar19->Name + lVar28));
      *(undefined4 *)((long)&pIVar19->Name + lVar26) = 0;
    }
LAB_001545bb:
    IVar49 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar48 = IVar49.x;
    fVar60 = IVar49.y;
    if (((fVar48 != 0.0) || (NAN(fVar48))) && (pIVar19->ScrollbarX == true)) {
      (pIVar19->ScrollTarget).x = (float)(int)(fVar48 * fVar58 + (pIVar19->Scroll).x);
      (pIVar19->ScrollTargetCenterRatio).x = 0.0;
      pIVar31->NavMoveFromClampedRefRect = true;
    }
    if ((fVar60 != 0.0) || (NAN(fVar60))) {
      (pIVar19->ScrollTarget).y = (float)(int)(fVar60 * fVar58 + (pIVar19->Scroll).y);
      (pIVar19->ScrollTargetCenterRatio).y = 0.0;
      pIVar31->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar31->NavMoveResultLocal).ID = 0;
  (pIVar31->NavMoveResultLocal).SelectScopeId = 0;
  (pIVar31->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar31->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar31->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar31->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar31->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar31->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar31->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar31->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar31->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar31->NavMoveResultLocalVisibleSet).SelectScopeId = 0;
  (pIVar31->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar31->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar31->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar31->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar31->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar31->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar31->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar31->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar31->NavMoveResultOther).ID = 0;
  (pIVar31->NavMoveResultOther).SelectScopeId = 0;
  (pIVar31->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar31->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar31->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar31->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar31->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar31->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar31->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar31->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((uVar15 != 0xffffffff) && (pIVar31->NavMoveFromClampedRefRect == true)) &&
     (pIVar31->NavLayer == ImGuiNavLayer_Main)) {
    IVar49 = (pIVar19->InnerRect).Min;
    fVar58 = (pIVar19->Pos).x;
    fVar60 = (pIVar19->Pos).y;
    fVar53 = (IVar49.x - fVar58) + -1.0;
    fVar57 = (IVar49.y - fVar60) + -1.0;
    IVar49 = (pIVar19->InnerRect).Max;
    fVar48 = (IVar49.x - fVar58) + 1.0;
    fVar60 = (IVar49.y - fVar60) + 1.0;
    fVar58 = pIVar19->NavRectRel[0].Min.x;
    if (((fVar58 < fVar53) || (pIVar19->NavRectRel[0].Min.y < fVar57)) ||
       ((fVar48 < pIVar19->NavRectRel[0].Max.x || (fVar60 < pIVar19->NavRectRel[0].Max.y)))) {
      fVar63 = pIVar39->FontBaseSize * pIVar19->FontWindowScale * pIVar19->FontDpiScale;
      if (pIVar19->ParentWindow != (ImGuiWindow *)0x0) {
        fVar63 = fVar63 * pIVar19->ParentWindow->FontWindowScale;
      }
      auVar62._0_4_ = fVar63 * 0.5;
      auVar65._0_4_ = fVar48 - fVar53;
      auVar65._4_4_ = fVar60 - fVar57;
      auVar65._8_8_ = 0;
      auVar62._4_4_ = auVar62._0_4_;
      auVar62._8_4_ = auVar62._0_4_;
      auVar62._12_4_ = auVar62._0_4_;
      auVar66 = minps(auVar65,auVar62);
      fVar53 = fVar53 + auVar66._0_4_;
      fVar57 = fVar57 + auVar66._4_4_;
      fVar63 = pIVar19->NavRectRel[0].Min.y;
      uVar15 = -(uint)(fVar53 <= fVar58);
      uVar46 = -(uint)(fVar57 <= fVar63);
      auVar52._0_4_ = fVar48 - auVar66._0_4_;
      auVar52._4_4_ = fVar60 - auVar66._4_4_;
      auVar52._8_4_ = 0.0 - auVar66._8_4_;
      auVar52._12_4_ = 0.0 - auVar66._12_4_;
      auVar55._8_8_ = 0;
      auVar55._0_4_ = pIVar19->NavRectRel[0].Max.x;
      auVar55._4_4_ = pIVar19->NavRectRel[0].Max.y;
      auVar66 = minps(auVar55,auVar52);
      pIVar19->NavRectRel[0].Min =
           (ImVec2)(CONCAT44(~uVar46 & (uint)fVar57,~uVar15 & (uint)fVar53) |
                   CONCAT44((uint)fVar63 & uVar46,(uint)fVar58 & uVar15));
      pIVar19->NavRectRel[0].Max = auVar66._0_8_;
      pIVar31->NavId = 0;
      pIVar19 = pIVar31->NavWindow;
    }
    pIVar31->NavMoveFromClampedRefRect = false;
  }
  if (pIVar19 == (ImGuiWindow *)0x0) {
    fVar58 = 1.0;
    fVar48 = 0.0;
    fVar60 = 0.0;
    fVar53 = 0.0;
  }
  else {
    IVar32 = pIVar31->NavLayer;
    fVar58 = pIVar19->NavRectRel[IVar32].Min.x;
    fVar57 = pIVar19->NavRectRel[IVar32].Max.x;
    fVar63 = 0.0;
    if (fVar57 < fVar58) {
      fVar48 = 0.0;
      fVar53 = 0.0;
      fVar60 = 0.0;
    }
    else {
      fVar4 = pIVar19->NavRectRel[IVar32].Min.y;
      fVar5 = pIVar19->NavRectRel[IVar32].Max.y;
      fVar48 = 0.0;
      fVar60 = 0.0;
      fVar53 = 0.0;
      if (fVar4 <= fVar5) {
        fVar63 = fVar58;
        fVar48 = fVar4;
        fVar60 = fVar5;
        fVar53 = fVar57;
      }
    }
    fVar58 = (pIVar19->Pos).x;
    fVar57 = (pIVar19->Pos).y;
    fVar48 = fVar48 + fVar57;
    fVar53 = fVar53 + fVar58;
    fVar60 = fVar60 + fVar57;
    fVar58 = fVar63 + fVar58 + 1.0;
  }
  if (fVar53 <= fVar58) {
    fVar58 = fVar53;
  }
  (pIVar31->NavScoringRectScreen).Min.y = fVar48 + fVar47;
  (pIVar31->NavScoringRectScreen).Max.y = fVar60 + fVar47;
  (pIVar31->NavScoringRectScreen).Min.x = fVar58;
  (pIVar31->NavScoringRectScreen).Max.x = fVar58;
  pIVar31->NavScoringCount = 0;
  fVar47 = (pIVar39->IO).MousePos.x;
  fVar58 = (pIVar39->IO).MousePos.y;
  if ((-256000.0 <= fVar47) && (-256000.0 <= fVar58)) {
    fVar47 = (float)(int)fVar47;
    fVar58 = (float)(int)fVar58;
    (pIVar39->LastValidMousePos).x = fVar47;
    (pIVar39->LastValidMousePos).y = fVar58;
    (pIVar39->IO).MousePos.x = fVar47;
    (pIVar39->IO).MousePos.y = fVar58;
  }
  if ((fVar47 < -256000.0) || (fVar58 < -256000.0)) {
LAB_00154995:
    (pIVar39->IO).MouseDelta.x = 0.0;
    (pIVar39->IO).MouseDelta.y = 0.0;
  }
  else {
    IVar49 = (pIVar39->IO).MousePosPrev;
    fVar48 = IVar49.x;
    if ((fVar48 < -256000.0) || (fVar60 = IVar49.y, fVar60 < -256000.0)) goto LAB_00154995;
    IVar61.x = fVar47 - fVar48;
    IVar61.y = fVar58 - fVar60;
    (pIVar39->IO).MouseDelta = IVar61;
    if ((((IVar61.x != 0.0) || (NAN(IVar61.x))) || (IVar61.y != 0.0)) || (NAN(IVar61.y))) {
      pIVar39->NavDisableMouseHover = false;
    }
  }
  IVar49 = (pIVar39->IO).MousePos;
  (pIVar39->IO).MousePosPrev = IVar49;
  fVar47 = IVar49.x;
  lVar26 = 0;
  do {
    bVar44 = (pIVar39->IO).MouseDown[lVar26];
    if ((bool)bVar44 == true) {
      fVar48 = (pIVar39->IO).MouseDownDuration[lVar26];
      pbVar36 = (pIVar39->IO).MouseClicked + lVar26;
      *pbVar36 = fVar48 < 0.0;
      pbVar36[10] = false;
      (pIVar39->IO).MouseDownDurationPrev[lVar26] = fVar48;
      if (0.0 <= fVar48) {
        (pIVar39->IO).MouseDownDuration[lVar26] = fVar48 + (pIVar39->IO).DeltaTime;
        (pIVar39->IO).MouseDoubleClicked[lVar26] = false;
        auVar67 = ZEXT816(0);
        if (-256000.0 <= fVar47 && -256000.0 <= fVar58) {
          IVar61 = (pIVar39->IO).MouseClickedPos[lVar26];
          auVar67._0_4_ = fVar47 - IVar61.x;
          auVar67._4_4_ = fVar58 - IVar61.y;
          auVar67._8_8_ = 0;
        }
        fVar48 = (pIVar39->IO).MouseDragMaxDistanceSqr[lVar26];
        fVar60 = auVar67._0_4_ * auVar67._0_4_ + auVar67._4_4_ * auVar67._4_4_;
        uVar15 = -(uint)(fVar60 <= fVar48);
        (pIVar39->IO).MouseDragMaxDistanceSqr[lVar26] =
             (float)(~uVar15 & (uint)fVar60 | (uint)fVar48 & uVar15);
        IVar61 = (pIVar39->IO).MouseDragMaxDistanceAbs[lVar26];
        fVar48 = IVar61.x;
        fVar60 = IVar61.y;
        auVar68._0_8_ = auVar67._0_8_ ^ 0x8000000080000000;
        auVar68._8_4_ = auVar67._8_4_ ^ 0x80000000;
        auVar68._12_4_ = auVar67._12_4_ ^ 0x80000000;
        auVar66 = maxps(auVar68,auVar67);
        uVar15 = -(uint)(auVar66._0_4_ <= fVar48);
        uVar46 = -(uint)(auVar66._4_4_ <= fVar60);
        (pIVar39->IO).MouseDragMaxDistanceAbs[lVar26] =
             (ImVec2)(CONCAT44(~uVar46 & (uint)auVar66._4_4_,~uVar15 & (uint)auVar66._0_4_) |
                     CONCAT44((uint)fVar60 & uVar46,(uint)fVar48 & uVar15));
      }
      else {
        (pIVar39->IO).MouseDownDuration[lVar26] = 0.0;
        (pIVar39->IO).MouseDoubleClicked[lVar26] = false;
        dVar64 = pIVar39->Time;
        if ((float)(dVar64 - (pIVar39->IO).MouseClickedTime[lVar26]) <
            (pIVar39->IO).MouseDoubleClickTime) {
          fVar48 = 0.0;
          fVar60 = 0.0;
          if (-256000.0 <= fVar47 && -256000.0 <= fVar58) {
            IVar61 = (pIVar39->IO).MouseClickedPos[lVar26];
            fVar48 = fVar47 - IVar61.x;
            fVar60 = fVar58 - IVar61.y;
          }
          fVar53 = (pIVar39->IO).MouseDoubleClickMaxDist;
          dVar64 = -3.4028234663852886e+38;
          if (fVar48 * fVar48 + fVar60 * fVar60 < fVar53 * fVar53) {
            (pIVar39->IO).MouseDoubleClicked[lVar26] = true;
            dVar64 = -3.4028234663852886e+38;
          }
        }
        (pIVar39->IO).MouseClickedTime[lVar26] = dVar64;
        (pIVar39->IO).MouseClickedPos[lVar26] = IVar49;
        (pIVar39->IO).MouseDownWasDoubleClick[lVar26] = (pIVar39->IO).MouseDoubleClicked[lVar26];
        pIVar1 = (pIVar39->IO).MouseDragMaxDistanceAbs + lVar26;
        pIVar1->x = 0.0;
        pIVar1->y = 0.0;
        (pIVar39->IO).MouseDragMaxDistanceSqr[lVar26] = 0.0;
        bVar44 = (pIVar39->IO).MouseDown[lVar26];
      }
    }
    else {
      (pIVar39->IO).MouseClicked[lVar26] = false;
      fVar48 = (pIVar39->IO).MouseDownDuration[lVar26];
      (pIVar39->IO).MouseReleased[lVar26] = 0.0 <= fVar48;
      pbVar36 = (pIVar39->IO).MouseClicked + lVar26;
      (pIVar39->IO).MouseDownDurationPrev[lVar26] = fVar48;
      (pIVar39->IO).MouseDownDuration[lVar26] = -1.0;
      (pIVar39->IO).MouseDoubleClicked[lVar26] = false;
    }
    if (((bVar44 & 1) == 0) && ((pIVar39->IO).MouseReleased[lVar26] == false)) {
      (pIVar39->IO).MouseDownWasDoubleClick[lVar26] = false;
    }
    if (*pbVar36 == true) {
      pIVar39->NavDisableMouseHover = false;
    }
    lVar26 = lVar26 + 1;
  } while (lVar26 != 5);
  fVar47 = (ctx->IO).DeltaTime;
  iVar18 = ctx->FramerateSecPerFrameIdx;
  ctx->FramerateSecPerFrameAccum =
       (fVar47 - ctx->FramerateSecPerFrame[iVar18]) + ctx->FramerateSecPerFrameAccum;
  ctx->FramerateSecPerFrame[iVar18] = fVar47;
  iVar17 = iVar18 + (int)((ulong)((long)(iVar18 + 1) * -0x77777777) >> 0x20) + 1;
  ctx->FramerateSecPerFrameIdx = iVar18 + 1 + ((iVar17 >> 6) - (iVar17 >> 0x1f)) * -0x78;
  uVar15 = -(uint)(0.0 < ctx->FramerateSecPerFrameAccum);
  (ctx->IO).Framerate =
       (float)(~uVar15 & 0x7f7fffff |
              (uint)(1.0 / (ctx->FramerateSecPerFrameAccum / 120.0)) & uVar15);
  DockContextUpdateUndocking(ctx);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar19 = GetTopMostPopupModal();
  if ((pIVar19 != (ImGuiWindow *)0x0) ||
     ((ctx->NavWindowingTarget != (ImGuiWindow *)0x0 && (0.0 < ctx->NavWindowingHighlightAlpha)))) {
    fVar47 = (ctx->IO).DeltaTime * 6.0 + ctx->DimBgRatio;
    if (1.0 <= fVar47) {
      fVar47 = 1.0;
    }
    ctx->DimBgRatio = fVar47;
  }
  else {
    fVar47 = (ctx->IO).DeltaTime * -10.0 + ctx->DimBgRatio;
    ctx->DimBgRatio = (float)(-(uint)(0.0 <= fVar47) & (uint)fVar47);
  }
  ctx->MouseCursor = 0;
  ctx->WantTextInputNextFrame = -1;
  ctx->WantCaptureMouseNextFrame = -1;
  ctx->WantCaptureKeyboardNextFrame = -1;
  (ctx->PlatformImePos).x = 1.0;
  (ctx->PlatformImePos).y = 1.0;
  ctx->PlatformImePosViewport = (ImGuiViewportP *)0x0;
  pIVar31 = GImGui;
  pIVar19 = GImGui->WheelingWindow;
  if (pIVar19 == (ImGuiWindow *)0x0) {
LAB_00154df5:
    pIVar19 = (ImGuiWindow *)0x0;
  }
  else {
    fVar58 = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    GImGui->WheelingWindowTimer = fVar58;
    fVar47 = (pIVar31->IO).MousePos.x;
    if ((((-256000.0 <= fVar47) && (fVar48 = (pIVar31->IO).MousePos.y, -256000.0 <= fVar48)) &&
        (fVar47 = fVar47 - (pIVar31->WheelingWindowRefMousePos).x,
        fVar48 = fVar48 - (pIVar31->WheelingWindowRefMousePos).y,
        fVar60 = (pIVar31->IO).MouseDragThreshold,
        fVar60 * fVar60 < fVar47 * fVar47 + fVar48 * fVar48)) || (fVar58 <= 0.0)) {
      pIVar31->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar31->WheelingWindowTimer = 0.0;
      goto LAB_00154df5;
    }
  }
  fVar47 = (pIVar31->IO).MouseWheel;
  if (((((fVar47 != 0.0) || (fVar58 = (pIVar31->IO).MouseWheelH, fVar58 != 0.0)) || (NAN(fVar58)))
      && ((pIVar24 = pIVar19, pIVar19 != (ImGuiWindow *)0x0 ||
          (pIVar24 = pIVar31->HoveredWindow, pIVar24 != (ImGuiWindow *)0x0)))) &&
     (pIVar24->Collapsed == false)) {
    if ((fVar47 != 0.0) || (NAN(fVar47))) {
      if ((pIVar31->IO).KeyCtrl == true) {
        if ((pIVar31->IO).FontAllowUserScaling == true) {
          if (pIVar19 != pIVar24) {
            pIVar31->WheelingWindow = pIVar24;
            pIVar31->WheelingWindowRefMousePos = (pIVar31->IO).MousePos;
            pIVar31->WheelingWindowTimer = 2.0;
          }
          fVar58 = pIVar24->FontWindowScale;
          fVar48 = fVar47 * 0.1 + fVar58;
          fVar47 = 2.5;
          if (fVar48 <= 2.5) {
            fVar47 = fVar48;
          }
          fVar47 = (float)(-(uint)(fVar48 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar48 < 0.5) & (uint)fVar47);
          pIVar24->FontWindowScale = fVar47;
          if ((pIVar24->Flags & 0x1000000) == 0) {
            fVar47 = fVar47 / fVar58;
            IVar49 = pIVar24->Size;
            auVar56._8_8_ = 0;
            auVar56._0_4_ = IVar49.x;
            auVar56._4_4_ = IVar49.y;
            IVar61 = (pIVar31->IO).MousePos;
            fVar58 = (pIVar24->Pos).x;
            fVar48 = (pIVar24->Pos).y;
            auVar59._0_4_ = (IVar61.x - fVar58) * (1.0 - fVar47) * IVar49.x;
            auVar59._4_4_ = (IVar61.y - fVar48) * (1.0 - fVar47) * IVar49.y;
            auVar59._8_8_ = 0;
            auVar66 = divps(auVar59,auVar56);
            local_50.Min.x = auVar66._0_4_ + fVar58;
            local_50.Min.y = auVar66._4_4_ + fVar48;
            SetWindowPos(pIVar24,&local_50.Min,0);
            IVar50.x = (float)(int)((pIVar24->Size).x * fVar47);
            IVar50.y = (float)(int)((pIVar24->Size).y * fVar47);
            IVar54.x = (float)(int)((pIVar24->SizeFull).x * fVar47);
            IVar54.y = (float)(int)((pIVar24->SizeFull).y * fVar47);
            pIVar24->Size = IVar50;
            pIVar24->SizeFull = IVar54;
          }
          goto LAB_00154e3a;
        }
      }
      else if ((pIVar31->IO).KeyShift == false) {
        if (pIVar19 != pIVar24) {
          pIVar31->WheelingWindow = pIVar24;
          pIVar31->WheelingWindowRefMousePos = (pIVar31->IO).MousePos;
          pIVar31->WheelingWindowTimer = 2.0;
          pIVar19 = pIVar24;
        }
        uVar15 = pIVar24->Flags;
        while (((uVar15 >> 0x18 & 1) != 0 &&
               (((uVar15 & 0x210) == 0x10 ||
                ((fVar58 = (pIVar24->ScrollMax).y, fVar58 == 0.0 && (!NAN(fVar58)))))))) {
          pIVar24 = pIVar24->ParentWindow;
          uVar15 = pIVar24->Flags;
        }
        if ((uVar15 & 0x210) == 0) {
          fVar58 = ((pIVar24->InnerRect).Max.y - (pIVar24->InnerRect).Min.y) * 0.67;
          fVar48 = pIVar31->FontBaseSize * pIVar24->FontWindowScale * pIVar24->FontDpiScale;
          if (pIVar24->ParentWindow != (ImGuiWindow *)0x0) {
            fVar48 = fVar48 * pIVar24->ParentWindow->FontWindowScale;
          }
          fVar60 = fVar48 * 5.0;
          if (fVar58 <= fVar48 * 5.0) {
            fVar60 = fVar58;
          }
          (pIVar24->ScrollTarget).y = (pIVar24->Scroll).y - (float)(int)fVar60 * fVar47;
          (pIVar24->ScrollTargetCenterRatio).y = 0.0;
        }
      }
    }
    fVar58 = (pIVar31->IO).MouseWheelH;
    if (((((fVar58 != 0.0) || (NAN(fVar58))) && ((pIVar31->IO).KeyShift != true)) ||
        (((fVar47 != 0.0 || (NAN(fVar47))) && (fVar58 = fVar47, (pIVar31->IO).KeyShift == true))))
       && ((pIVar31->IO).KeyCtrl == false)) {
      if (pIVar19 != pIVar24) {
        pIVar31->WheelingWindow = pIVar24;
        pIVar31->WheelingWindowRefMousePos = (pIVar31->IO).MousePos;
        pIVar31->WheelingWindowTimer = 2.0;
      }
      uVar15 = pIVar24->Flags;
      while (((uVar15 >> 0x18 & 1) != 0 &&
             (((uVar15 & 0x210) == 0x10 ||
              ((fVar47 = (pIVar24->ScrollMax).x, fVar47 == 0.0 && (!NAN(fVar47)))))))) {
        pIVar24 = pIVar24->ParentWindow;
        uVar15 = pIVar24->Flags;
      }
      if ((uVar15 & 0x210) == 0) {
        fVar47 = ((pIVar24->InnerRect).Max.x - (pIVar24->InnerRect).Min.x) * 0.67;
        fVar48 = pIVar31->FontBaseSize * pIVar24->FontWindowScale * pIVar24->FontDpiScale;
        if (pIVar24->ParentWindow != (ImGuiWindow *)0x0) {
          fVar48 = fVar48 * pIVar24->ParentWindow->FontWindowScale;
        }
        fVar60 = fVar48 + fVar48;
        if (fVar47 <= fVar48 + fVar48) {
          fVar60 = fVar47;
        }
        (pIVar24->ScrollTarget).x = (pIVar24->Scroll).x - fVar58 * (float)(int)fVar60;
        (pIVar24->ScrollTargetCenterRatio).x = 0.0;
      }
    }
  }
LAB_00154e3a:
  pIVar19 = ctx->NavWindow;
  if ((((pIVar19 == (ImGuiWindow *)0x0) || (pIVar19->Active != true)) ||
      ((pIVar19->Flags & 0x40000) != 0)) ||
     (((ctx->IO).KeyCtrl != false || (iVar18 = (GImGui->IO).KeyMap[0], iVar18 < 0)))) {
    ctx->FocusTabPressed = false;
LAB_00154ed5:
    pIVar24 = ctx->FocusRequestNextWindow;
    ctx->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
    ctx->FocusRequestCurrCounterAll = 0x7fffffff;
    ctx->FocusRequestCurrCounterTab = 0x7fffffff;
    if (pIVar24 == (ImGuiWindow *)0x0) goto LAB_00154f67;
  }
  else {
    bVar41 = IsKeyPressed(iVar18,true);
    ctx->FocusTabPressed = bVar41;
    if ((!bVar41) || (ctx->ActiveId != 0)) goto LAB_00154ed5;
    ctx->FocusRequestNextWindow = pIVar19;
    ctx->FocusRequestNextCounterAll = 0x7fffffff;
    if ((ctx->NavId == 0) || (ctx->NavIdTabCounter == 0x7fffffff)) {
      iVar18 = -(uint)(ctx->IO).KeyShift;
    }
    else {
      iVar18 = ctx->NavIdTabCounter + (-(uint)(ctx->IO).KeyShift | 1) + 1;
    }
    ctx->FocusRequestNextCounterTab = iVar18;
    ctx->FocusRequestCurrCounterAll = 0x7fffffff;
    ctx->FocusRequestCurrCounterTab = 0x7fffffff;
    pIVar24 = pIVar19;
  }
  ctx->FocusRequestCurrWindow = pIVar24;
  if ((ctx->FocusRequestNextCounterAll != 0x7fffffff) &&
     (iVar18 = (pIVar24->DC).FocusCounterAll, iVar18 != -1)) {
    ctx->FocusRequestCurrCounterAll = (ctx->FocusRequestNextCounterAll + iVar18 + 1) % (iVar18 + 1);
  }
  if ((ctx->FocusRequestNextCounterTab != 0x7fffffff) &&
     (iVar18 = (pIVar24->DC).FocusCounterTab, iVar18 != -1)) {
    ctx->FocusRequestCurrCounterTab = (ctx->FocusRequestNextCounterTab + iVar18 + 1) % (iVar18 + 1);
  }
  ctx->FocusRequestNextWindow = (ImGuiWindow *)0x0;
  ctx->FocusRequestNextCounterAll = 0x7fffffff;
  ctx->FocusRequestNextCounterTab = 0x7fffffff;
LAB_00154f67:
  ctx->NavIdTabCounter = 0x7fffffff;
  fVar47 = (ctx->IO).ConfigWindowsMemoryCompactTimer;
  if (0.0 <= fVar47) {
    fVar47 = (float)ctx->Time - fVar47;
  }
  else {
    fVar47 = 3.4028235e+38;
  }
  uVar15 = (ctx->Windows).Size;
  if (uVar15 != 0) {
    uVar40 = 0;
    do {
      pIVar19 = (ctx->Windows).Data[uVar40];
      bVar41 = pIVar19->Active;
      pIVar19->WasActive = bVar41;
      pIVar19->BeginCount = 0;
      pIVar19->Active = false;
      pIVar19->WriteAccessed = false;
      if (((bVar41 == false) && (pIVar19->MemoryCompacted == false)) &&
         (pIVar19->LastTimeActive <= fVar47 && fVar47 != pIVar19->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar19);
        uVar15 = (ctx->Windows).Size;
      }
      uVar40 = uVar40 + 1;
    } while (uVar40 != uVar15);
    pIVar19 = ctx->NavWindow;
  }
  if ((pIVar19 != (ImGuiWindow *)0x0) && (pIVar19->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  if ((ctx->CurrentWindowStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar2 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar2 = *piVar2 + 1;
    }
    __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar8 = (ctx->CurrentWindowStack).Data;
    if (ppIVar8 != (ImGuiWindow **)0x0) {
      memcpy(__dest,ppIVar8,(long)(ctx->CurrentWindowStack).Size << 3);
      ppIVar8 = (ctx->CurrentWindowStack).Data;
      if ((ppIVar8 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar8,GImAllocatorUserData);
    }
    (ctx->CurrentWindowStack).Data = __dest;
    (ctx->CurrentWindowStack).Capacity = 0;
  }
  (ctx->CurrentWindowStack).Size = 0;
  if ((ctx->BeginPopupStack).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar2 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar2 = *piVar2 + 1;
    }
    __dest_00 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar12 = (ctx->BeginPopupStack).Data;
    if (pIVar12 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_00,pIVar12,(long)(ctx->BeginPopupStack).Size * 0x30);
      pIVar12 = (ctx->BeginPopupStack).Data;
      if ((pIVar12 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar12,GImAllocatorUserData);
    }
    (ctx->BeginPopupStack).Data = __dest_00;
    (ctx->BeginPopupStack).Capacity = 0;
  }
  (ctx->BeginPopupStack).Size = 0;
  pIVar31 = (ImGuiContext *)0x0;
  ClosePopupsOverWindow(ctx->NavWindow,false);
  DockContextUpdateDocking((ImGui *)ctx,pIVar31);
  pIVar31 = GImGui;
  GImGui->DebugItemPickerBreakID = 0;
  if (pIVar31->DebugItemPickerActive == true) {
    uVar15 = pIVar31->HoveredIdPreviousFrame;
    pIVar31->MouseCursor = 7;
    iVar18 = (pIVar31->IO).KeyMap[0xe];
    if ((-1 < iVar18) && (bVar41 = IsKeyPressed(iVar18,true), bVar41)) {
      pIVar31->DebugItemPickerActive = false;
    }
    fVar47 = (pIVar31->IO).MouseDownDuration[0];
    if ((fVar47 != 0.0) || (NAN(fVar47))) {
      uVar46 = (uint)(uVar15 == 0);
    }
    else if (uVar15 == 0) {
      uVar46 = 1;
    }
    else {
      pIVar31->DebugItemPickerBreakID = uVar15;
      pIVar31->DebugItemPickerActive = false;
      uVar46 = 0;
    }
    *(byte *)&(pIVar31->NextWindowData).Flags = (byte)(pIVar31->NextWindowData).Flags | 0x40;
    (pIVar31->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltip();
    Text("HoveredId: 0x%08X",(ulong)uVar15);
    Text("Press ESC to abort picking.");
    TextColored((ImVec4 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar46 << 4)),
                "Click to break in debugger!");
    End();
    pIVar31 = GImGui;
  }
  ctx->WithinFrameScopeWithImplicitWindow = true;
  *(byte *)&(pIVar31->NextWindowData).Flags = (byte)(pIVar31->NextWindowData).Flags | 2;
  (pIVar31->NextWindowData).SizeVal.x = 400.0;
  (pIVar31->NextWindowData).SizeVal.y = 400.0;
  (pIVar31->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check and assert for various common IO and Configuration mistakes
    g.ConfigFlagsLastFrame = g.ConfigFlagsCurrFrame;
    NewFrameSanityChecks();
    g.ConfigFlagsCurrFrame = g.IO.ConfigFlags;

    // Load settings on first frame (if not explicitly loaded manually before)
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        if (g.IO.IniFilename)
            LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay after the last modification, so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
        {
            if (g.IO.IniFilename != NULL)
                SaveIniSettingsToDisk(g.IO.IniFilename);
            else
                g.IO.WantSaveIniSettings = true;  // Let user know they can call SaveIniSettingsToMemory(). user will need to clear io.WantSaveIniSettings themselves.
            g.SettingsDirtyTimer = 0.0f;
        }
    }

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    // FIXME-VIEWPORT: the concept of a single ClipRectFullscreen is not ideal!
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetRect());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(virtual_space.Min.x, virtual_space.Min.y, virtual_space.Max.x, virtual_space.Max.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawData = NULL;
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputTextId != 0 && g.ActiveId != g.TempInputTextId)
        g.TempInputTextId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = g.ActiveIdUsingNavInputMask = 0;
        g.ActiveIdUsingKeyInputMask = 0;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSourceOrTarget = false;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Undocking
    // (needs to be before UpdateMouseMovingWindowNewFrame so the window is already offset and following the mouse on the detaching frame)
    DockContextUpdateUndocking(&g);

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default
    g.PlatformImePosViewport = NULL;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Pressing TAB activate widget focus
    g.FocusTabPressed = (g.NavWindow && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab));
    if (g.ActiveId == 0 && g.FocusTabPressed)
    {
        // Note that SetKeyboardFocusHere() sets the Next fields mid-frame. To be consistent we also
        // manipulate the Next fields even, even though they will be turned into Curr fields by the code below.
        g.FocusRequestNextWindow = g.NavWindow;
        g.FocusRequestNextCounterAll = INT_MAX;
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.FocusRequestNextCounterTab = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.FocusRequestNextCounterTab = g.IO.KeyShift ? -1 : 0;
    }

    // Turn queued focus request into current one
    g.FocusRequestCurrWindow = NULL;
    g.FocusRequestCurrCounterAll = g.FocusRequestCurrCounterTab = INT_MAX;
    if (g.FocusRequestNextWindow != NULL)
    {
        ImGuiWindow* window = g.FocusRequestNextWindow;
        g.FocusRequestCurrWindow = window;
        if (g.FocusRequestNextCounterAll != INT_MAX && window->DC.FocusCounterAll != -1)
            g.FocusRequestCurrCounterAll = ImModPositive(g.FocusRequestNextCounterAll, window->DC.FocusCounterAll + 1);
        if (g.FocusRequestNextCounterTab != INT_MAX && window->DC.FocusCounterTab != -1)
            g.FocusRequestCurrCounterTab = ImModPositive(g.FocusRequestNextCounterTab, window->DC.FocusCounterTab + 1);
        g.FocusRequestNextWindow = NULL;
        g.FocusRequestNextCounterAll = g.FocusRequestNextCounterTab = INT_MAX;
    }

    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.IO.ConfigWindowsMemoryCompactTimer >= 0.0f) ? (float)g.Time - g.IO.ConfigWindowsMemoryCompactTimer : FLT_MAX;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect (this is totally functional but we may need decide if the side-effects are desirable)
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // Docking
    DockContextUpdateDocking(&g);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}